

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O3

void __thiscall Js::AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo(AutoRestoreFunctionInfo *this)

{
  Type *addr;
  FunctionInfo *this_00;
  FunctionBody *this_01;
  ParseableFunctionInfo *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionBody *this_02;
  FunctionInfo *functionInfo;
  
  this_02 = (FunctionBody *)this->pfi;
  if (this_02 != (FunctionBody *)0x0) {
    this_00 = (this_02->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    this_01 = (FunctionBody *)(this_00->functionBodyImpl).ptr;
    if (this_01 != this_02) {
      bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)this_01);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar3) goto LAB_007765fe;
        *puVar4 = 0;
      }
      FunctionBody::RedeferFunctionObjectTypes(this_01);
      addr = &this_00->functionBodyImpl;
      *(undefined1 *)&this_00->attributes = (char)this_00->attributes | DeferredParse;
      pPVar1 = this->pfi;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = &pPVar1->super_FunctionProxy;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      FunctionInfo::SetOriginalEntryPoint(this_00,this->originalEntryPoint);
      this_02 = (FunctionBody *)this->pfi;
      if (this_02 == (FunctionBody *)0x0) {
        return;
      }
    }
    if (((FunctionBody *)
         (((this_02->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
         functionBodyImpl).ptr == this_02) &&
       (bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)this_02), !bVar3)) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0xd86,
                                "(this->pfi == nullptr || (this->pfi->GetFunctionInfo()->GetFunctionProxy() == this->pfi && !this->pfi->IsFunctionBody()))"
                                ,
                                "this->pfi == nullptr || (this->pfi->GetFunctionInfo()->GetFunctionProxy() == this->pfi && !this->pfi->IsFunctionBody())"
                               );
    if (!bVar3) {
LAB_007765fe:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

~AutoRestoreFunctionInfo() {
            if (this->pfi != nullptr && this->pfi->GetFunctionInfo()->GetFunctionProxy() != this->pfi)
            {
                FunctionInfo *functionInfo = this->pfi->GetFunctionInfo();
                FunctionBody *functionBody = functionInfo->GetFunctionProxy()->GetFunctionBody();
                functionBody->RedeferFunctionObjectTypes();
                functionInfo->SetAttributes(
                    (FunctionInfo::Attributes)(functionInfo->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
                functionInfo->SetFunctionProxy(this->pfi);
                functionInfo->SetOriginalEntryPoint(originalEntryPoint);
            }

            Assert(this->pfi == nullptr || (this->pfi->GetFunctionInfo()->GetFunctionProxy() == this->pfi && !this->pfi->IsFunctionBody()));
        }